

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

maybe<unsigned_int,_void> *
pstore::json::details::string_matcher<pstore::json::null_output>::hex_value
          (maybe<unsigned_int,_void> *__return_storage_ptr__,char32_t c,uint value)

{
  uint local_20;
  int local_1c;
  uint local_18;
  uint digit;
  uint value_local;
  char32_t c_local;
  
  local_1c = 0;
  local_18 = value;
  digit = c;
  _value_local = __return_storage_ptr__;
  if (((uint)c < 0x30) || (0x39 < (uint)c)) {
    if (((uint)c < 0x61) || (0x66 < (uint)c)) {
      if (((uint)c < 0x41) || (0x46 < (uint)c)) {
        nothing<unsigned_int>();
        return __return_storage_ptr__;
      }
      local_1c = c + L'\xffffffc9';
    }
    else {
      local_1c = c + L'\xffffffa9';
    }
  }
  else {
    local_1c = c + L'\xffffffd0';
  }
  local_20 = value * 0x10 + local_1c;
  just<unsigned_int>(__return_storage_ptr__,&local_20);
  return __return_storage_ptr__;
}

Assistant:

maybe<unsigned> string_matcher<Callbacks>::hex_value (char32_t const c,
                                                                  unsigned const value) {
                auto digit = 0U;
                if (c >= '0' && c <= '9') {
                    digit = static_cast<unsigned> (c) - '0';
                } else if (c >= 'a' && c <= 'f') {
                    digit = static_cast<unsigned> (c) - 'a' + 10;
                } else if (c >= 'A' && c <= 'F') {
                    digit = static_cast<unsigned> (c) - 'A' + 10;
                } else {
                    return nothing<unsigned> ();
                }
                return just (16 * value + digit);
            }